

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QLatin1StringView propertyNameForStandardPixmap(StandardPixmap sp)

{
  qsizetype qVar1;
  char *pcVar2;
  QLatin1StringView QVar3;
  QLatin1StringView QVar4;
  QLatin1StringView QVar5;
  QLatin1StringView QVar6;
  QLatin1StringView QVar7;
  QLatin1StringView QVar8;
  QLatin1StringView QVar9;
  QLatin1StringView QVar10;
  QLatin1StringView QVar11;
  QLatin1StringView QVar12;
  QLatin1StringView QVar13;
  QLatin1StringView QVar14;
  QLatin1StringView QVar15;
  QLatin1StringView QVar16;
  QLatin1StringView QVar17;
  QLatin1StringView QVar18;
  QLatin1StringView QVar19;
  QLatin1StringView QVar20;
  QLatin1StringView QVar21;
  QLatin1StringView QVar22;
  QLatin1StringView QVar23;
  QLatin1StringView QVar24;
  QLatin1StringView QVar25;
  QLatin1StringView QVar26;
  QLatin1StringView QVar27;
  
  pcVar2 = "titlebar-menu-icon";
  qVar1 = 0x12;
  switch(sp) {
  case SP_TitleBarMinButton:
    pcVar2 = "titlebar-minimize-icon";
    goto LAB_0036a609;
  case SP_TitleBarMaxButton:
    pcVar2 = "titlebar-maximize-icon";
LAB_0036a609:
    QVar12.m_data = pcVar2;
    QVar12.m_size = 0x16;
    return QVar12;
  case SP_TitleBarCloseButton:
    pcVar2 = "titlebar-close-icon";
    break;
  case SP_TitleBarNormalButton:
    QVar15.m_data = "titlebar-normal-icon";
    QVar15.m_size = 0x14;
    return QVar15;
  case SP_TitleBarShadeButton:
    pcVar2 = "titlebar-shade-icon";
    break;
  case SP_TitleBarUnshadeButton:
    pcVar2 = "titlebar-unshade-icon";
    goto LAB_0036a6d1;
  case SP_TitleBarContextHelpButton:
    QVar6.m_data = "titlebar-contexthelp-icon";
    QVar6.m_size = 0x19;
    return QVar6;
  case SP_DockWidgetCloseButton:
    pcVar2 = "dockwidget-close-icon";
    goto LAB_0036a6d1;
  case SP_MessageBoxInformation:
    QVar9.m_data = "messagebox-information-icon";
    QVar9.m_size = 0x1b;
    return QVar9;
  case SP_MessageBoxWarning:
    QVar17.m_data = "messagebox-warning-icon";
    QVar17.m_size = 0x17;
    return QVar17;
  case SP_MessageBoxCritical:
    pcVar2 = "messagebox-critical-icon";
    goto LAB_0036a68f;
  case SP_MessageBoxQuestion:
    pcVar2 = "messagebox-question-icon";
    goto LAB_0036a68f;
  case SP_DesktopIcon:
    pcVar2 = "desktop-icon";
    goto LAB_0036a701;
  case SP_TrashIcon:
    QVar11.m_data = "trash-icon";
    QVar11.m_size = 10;
    return QVar11;
  case SP_ComputerIcon:
    pcVar2 = "computer-icon";
    goto LAB_0036a71b;
  case SP_DriveFDIcon:
    QVar18.m_data = "floppy-icon";
    QVar18.m_size = 0xb;
    return QVar18;
  case SP_DriveHDIcon:
    pcVar2 = "harddisk-icon";
    goto LAB_0036a71b;
  case SP_DriveCDIcon:
    QVar20.m_data = "cd-icon";
    QVar20.m_size = 7;
    return QVar20;
  case SP_DriveDVDIcon:
    QVar7.m_data = "dvd-icon";
    QVar7.m_size = 8;
    return QVar7;
  case SP_DriveNetIcon:
    pcVar2 = "network-icon";
    goto LAB_0036a701;
  case SP_DirOpenIcon:
    pcVar2 = "directory-open-icon";
    break;
  case SP_DirClosedIcon:
    pcVar2 = "directory-closed-icon";
    goto LAB_0036a6d1;
  case SP_DirLinkIcon:
    pcVar2 = "directory-link-icon";
    break;
  default:
    pcVar2 = "";
    qVar1 = 0;
  case SP_TitleBarMenuButton:
    QVar3.m_data = pcVar2;
    QVar3.m_size = qVar1;
    return QVar3;
  case SP_FileIcon:
    pcVar2 = "file-icon";
    goto LAB_0036a5b3;
  case SP_FileLinkIcon:
    pcVar2 = "file-link-icon";
    goto LAB_0036a6e7;
  case SP_FileDialogStart:
    pcVar2 = "filedialog-start-icon";
LAB_0036a6d1:
    QVar22.m_data = pcVar2;
    QVar22.m_size = 0x15;
    return QVar22;
  case SP_FileDialogEnd:
    pcVar2 = "filedialog-end-icon";
    break;
  case SP_FileDialogToParent:
    QVar4.m_data = "filedialog-parent-directory-icon";
    QVar4.m_size = 0x20;
    return QVar4;
  case SP_FileDialogNewFolder:
    QVar8.m_data = "filedialog-new-directory-icon";
    QVar8.m_size = 0x1d;
    return QVar8;
  case SP_FileDialogDetailedView:
    pcVar2 = "filedialog-detailedview-icon";
    goto LAB_0036a6f4;
  case SP_FileDialogInfoView:
    pcVar2 = "filedialog-infoview-icon";
    goto LAB_0036a68f;
  case SP_FileDialogContentsView:
    pcVar2 = "filedialog-contentsview-icon";
LAB_0036a6f4:
    QVar24.m_data = pcVar2;
    QVar24.m_size = 0x1c;
    return QVar24;
  case SP_FileDialogListView:
    pcVar2 = "filedialog-listview-icon";
    goto LAB_0036a68f;
  case SP_FileDialogBack:
    pcVar2 = "filedialog-backward-icon";
LAB_0036a68f:
    QVar19.m_data = pcVar2;
    QVar19.m_size = 0x18;
    return QVar19;
  case SP_DirIcon:
    pcVar2 = "directory-icon";
    goto LAB_0036a6e7;
  case SP_DialogOkButton:
    pcVar2 = "dialog-ok-icon";
    goto LAB_0036a6e7;
  case SP_DialogCancelButton:
    QVar14.m_data = "dialog-cancel-icon";
    QVar14.m_size = 0x12;
    return QVar14;
  case SP_DialogHelpButton:
    pcVar2 = "dialog-help-icon";
    goto LAB_0036a54e;
  case SP_DialogOpenButton:
    pcVar2 = "dialog-open-icon";
    goto LAB_0036a54e;
  case SP_DialogSaveButton:
    pcVar2 = "dialog-save-icon";
LAB_0036a54e:
    QVar5.m_data = pcVar2;
    QVar5.m_size = 0x10;
    return QVar5;
  case SP_DialogCloseButton:
    pcVar2 = "dialog-close-icon";
    goto LAB_0036a70e;
  case SP_DialogApplyButton:
    pcVar2 = "dialog-apply-icon";
    goto LAB_0036a70e;
  case SP_DialogResetButton:
    pcVar2 = "dialog-reset-icon";
LAB_0036a70e:
    QVar26.m_data = pcVar2;
    QVar26.m_size = 0x11;
    return QVar26;
  case SP_DialogDiscardButton:
    pcVar2 = "dialog-discard-icon";
    break;
  case SP_DialogYesButton:
    pcVar2 = "dialog-yes-icon";
    goto LAB_0036a622;
  case SP_DialogNoButton:
    pcVar2 = "dialog-no-icon";
    goto LAB_0036a6e7;
  case SP_ArrowUp:
    pcVar2 = "uparrow-icon";
    goto LAB_0036a701;
  case SP_ArrowDown:
    pcVar2 = "downarrow-icon";
    goto LAB_0036a6e7;
  case SP_ArrowLeft:
    pcVar2 = "leftarrow-icon";
LAB_0036a6e7:
    QVar23.m_data = pcVar2;
    QVar23.m_size = 0xe;
    return QVar23;
  case SP_ArrowRight:
    pcVar2 = "rightarrow-icon";
LAB_0036a622:
    QVar13.m_data = pcVar2;
    QVar13.m_size = 0xf;
    return QVar13;
  case SP_ArrowBack:
    pcVar2 = "backward-icon";
LAB_0036a71b:
    QVar27.m_data = pcVar2;
    QVar27.m_size = 0xd;
    return QVar27;
  case SP_ArrowForward:
    pcVar2 = "forward-icon";
LAB_0036a701:
    QVar25.m_data = pcVar2;
    QVar25.m_size = 0xc;
    return QVar25;
  case SP_DirHomeIcon:
    pcVar2 = "home-icon";
LAB_0036a5b3:
    QVar10.m_data = pcVar2;
    QVar10.m_size = 9;
    return QVar10;
  case SP_LineEditClearButton:
    QVar16.m_data = "lineedit-clear-button-icon";
    QVar16.m_size = 0x1a;
    return QVar16;
  }
  QVar21.m_data = pcVar2;
  QVar21.m_size = 0x13;
  return QVar21;
}

Assistant:

static QLatin1StringView propertyNameForStandardPixmap(QStyle::StandardPixmap sp)
{
    switch (sp) {
        case QStyle::SP_TitleBarMenuButton: return "titlebar-menu-icon"_L1;
        case QStyle::SP_TitleBarMinButton: return "titlebar-minimize-icon"_L1;
        case QStyle::SP_TitleBarMaxButton: return "titlebar-maximize-icon"_L1;
        case QStyle::SP_TitleBarCloseButton: return "titlebar-close-icon"_L1;
        case QStyle::SP_TitleBarNormalButton: return "titlebar-normal-icon"_L1;
        case QStyle::SP_TitleBarShadeButton: return "titlebar-shade-icon"_L1;
        case QStyle::SP_TitleBarUnshadeButton: return "titlebar-unshade-icon"_L1;
        case QStyle::SP_TitleBarContextHelpButton: return "titlebar-contexthelp-icon"_L1;
        case QStyle::SP_DockWidgetCloseButton: return "dockwidget-close-icon"_L1;
        case QStyle::SP_MessageBoxInformation: return "messagebox-information-icon"_L1;
        case QStyle::SP_MessageBoxWarning: return "messagebox-warning-icon"_L1;
        case QStyle::SP_MessageBoxCritical: return "messagebox-critical-icon"_L1;
        case QStyle::SP_MessageBoxQuestion: return "messagebox-question-icon"_L1;
        case QStyle::SP_DesktopIcon: return "desktop-icon"_L1;
        case QStyle::SP_TrashIcon: return "trash-icon"_L1;
        case QStyle::SP_ComputerIcon: return "computer-icon"_L1;
        case QStyle::SP_DriveFDIcon: return "floppy-icon"_L1;
        case QStyle::SP_DriveHDIcon: return "harddisk-icon"_L1;
        case QStyle::SP_DriveCDIcon: return "cd-icon"_L1;
        case QStyle::SP_DriveDVDIcon: return "dvd-icon"_L1;
        case QStyle::SP_DriveNetIcon: return "network-icon"_L1;
        case QStyle::SP_DirOpenIcon: return "directory-open-icon"_L1;
        case QStyle::SP_DirClosedIcon: return "directory-closed-icon"_L1;
        case QStyle::SP_DirLinkIcon: return "directory-link-icon"_L1;
        case QStyle::SP_FileIcon: return "file-icon"_L1;
        case QStyle::SP_FileLinkIcon: return "file-link-icon"_L1;
        case QStyle::SP_FileDialogStart: return "filedialog-start-icon"_L1;
        case QStyle::SP_FileDialogEnd: return "filedialog-end-icon"_L1;
        case QStyle::SP_FileDialogToParent: return "filedialog-parent-directory-icon"_L1;
        case QStyle::SP_FileDialogNewFolder: return "filedialog-new-directory-icon"_L1;
        case QStyle::SP_FileDialogDetailedView: return "filedialog-detailedview-icon"_L1;
        case QStyle::SP_FileDialogInfoView: return "filedialog-infoview-icon"_L1;
        case QStyle::SP_FileDialogContentsView: return "filedialog-contentsview-icon"_L1;
        case QStyle::SP_FileDialogListView: return "filedialog-listview-icon"_L1;
        case QStyle::SP_FileDialogBack: return "filedialog-backward-icon"_L1;
        case QStyle::SP_DirIcon: return "directory-icon"_L1;
        case QStyle::SP_DialogOkButton: return "dialog-ok-icon"_L1;
        case QStyle::SP_DialogCancelButton: return "dialog-cancel-icon"_L1;
        case QStyle::SP_DialogHelpButton: return "dialog-help-icon"_L1;
        case QStyle::SP_DialogOpenButton: return "dialog-open-icon"_L1;
        case QStyle::SP_DialogSaveButton: return "dialog-save-icon"_L1;
        case QStyle::SP_DialogCloseButton: return "dialog-close-icon"_L1;
        case QStyle::SP_DialogApplyButton: return "dialog-apply-icon"_L1;
        case QStyle::SP_DialogResetButton: return "dialog-reset-icon"_L1;
        case QStyle::SP_DialogDiscardButton: return "dialog-discard-icon"_L1;
        case QStyle::SP_DialogYesButton: return "dialog-yes-icon"_L1;
        case QStyle::SP_DialogNoButton: return "dialog-no-icon"_L1;
        case QStyle::SP_ArrowUp: return "uparrow-icon"_L1;
        case QStyle::SP_ArrowDown: return "downarrow-icon"_L1;
        case QStyle::SP_ArrowLeft: return "leftarrow-icon"_L1;
        case QStyle::SP_ArrowRight: return "rightarrow-icon"_L1;
        case QStyle::SP_ArrowBack: return "backward-icon"_L1;
        case QStyle::SP_ArrowForward: return "forward-icon"_L1;
        case QStyle::SP_DirHomeIcon: return "home-icon"_L1;
        case QStyle::SP_LineEditClearButton: return "lineedit-clear-button-icon"_L1;
        default: return ""_L1;
    }
}